

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpDisassemble::OnOpcodeV128
          (BinaryReaderObjdumpDisassemble *this,v128 value)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Result RVar5;
  BinaryReaderObjdumpDisassemble *this_local;
  v128 value_local;
  
  value_local.v._0_8_ = value.v._8_8_;
  register0x00000030 = value.v._0_8_;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)(value_local.v + 8),Ok);
  }
  else {
    uVar1 = v128::u32((v128 *)((long)&this_local + 4),0);
    uVar2 = v128::u32((v128 *)((long)&this_local + 4),1);
    uVar3 = v128::u32((v128 *)((long)&this_local + 4),2);
    uVar4 = v128::u32((v128 *)((long)&this_local + 4),3);
    LogOpcode(this,"0x%08x 0x%08x 0x%08x 0x%08x",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4
             );
    Result::Result((Result *)(value_local.v + 8),Ok);
  }
  RVar5.enum_._0_1_ = value_local.v[8];
  RVar5.enum_._1_1_ = value_local.v[9];
  RVar5.enum_._2_1_ = value_local.v[10];
  RVar5.enum_._3_1_ = value_local.v[0xb];
  return (Result)RVar5.enum_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeV128(v128 value) {
  if (!in_function_body) {
    return Result::Ok;
  }
  // v128 is always dumped as i32x4:
  LogOpcode("0x%08x 0x%08x 0x%08x 0x%08x", value.u32(0), value.u32(1),
            value.u32(2), value.u32(3));
  return Result::Ok;
}